

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_complex_acos(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp tmp;
  sexp local_50;
  sexp local_48;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_48;
  local_48 = (sexp)0x43e;
  local_40.var = &local_50;
  local_50 = (sexp)0x43e;
  local_40.next = &local_30;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_48 = sexp_complex_asin(ctx,z);
  local_50 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  psVar1 = sexp_make_flonum(ctx,1.5707963267948966);
  (local_50->value).type.name = psVar1;
  psVar1 = sexp_sub(ctx,local_50,local_48);
  (ctx->value).context.saves = local_30.next;
  return psVar1;
}

Assistant:

sexp sexp_complex_acos (sexp ctx, sexp z) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  res = sexp_complex_asin(ctx, z);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(tmp) = sexp_make_flonum(ctx, acos(-1)/2);
  res = sexp_sub(ctx, tmp, res);
  sexp_gc_release2(ctx);
  return res;
}